

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

int __thiscall flow::lang::Lexer::nextChar(Lexer *this,bool interscope)

{
  uint uVar1;
  int iVar2;
  Scope *pSVar3;
  Scope *pSVar4;
  size_type sVar5;
  int ch;
  bool interscope_local;
  Lexer *this_local;
  
  if (this->currentChar_ == -1) {
    this_local._4_4_ = this->currentChar_;
  }
  else {
    pSVar3 = scope(this);
    uVar1 = (pSVar3->currPos).column;
    (this->location_).end.line = (pSVar3->currPos).line;
    (this->location_).end.column = uVar1;
    (this->location_).end.offset = (pSVar3->currPos).offset;
    pSVar3 = scope(this);
    pSVar4 = scope(this);
    uVar1 = (pSVar3->nextPos).column;
    (pSVar4->currPos).line = (pSVar3->nextPos).line;
    (pSVar4->currPos).column = uVar1;
    (pSVar4->currPos).offset = (pSVar3->nextPos).offset;
    pSVar3 = scope(this);
    std::
    unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
    ::operator->(&pSVar3->stream);
    iVar2 = std::istream::get();
    if (iVar2 == -1) {
      this->currentChar_ = -1;
      if (interscope) {
        sVar5 = std::__cxx11::
                list<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                ::size(&this->contexts_);
        if (1 < sVar5) {
          leaveScope(this);
        }
      }
      this_local._4_4_ = this->currentChar_;
    }
    else {
      this->currentChar_ = iVar2;
      pSVar3 = scope(this);
      (pSVar3->nextPos).offset = (pSVar3->nextPos).offset + 1;
      if (this->currentChar_ == 10) {
        pSVar3 = scope(this);
        (pSVar3->nextPos).column = 1;
        pSVar3 = scope(this);
        (pSVar3->nextPos).line = (pSVar3->nextPos).line + 1;
      }
      else {
        pSVar3 = scope(this);
        (pSVar3->nextPos).column = (pSVar3->nextPos).column + 1;
      }
      this_local._4_4_ = this->currentChar_;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Lexer::nextChar(bool interscope) {
  if (currentChar_ == EOF) return currentChar_;

  location_.end = scope()->currPos;
  scope()->currPos = scope()->nextPos;

  int ch = scope()->stream->get();
  if (ch == EOF) {
    currentChar_ = ch;

    if (interscope && contexts_.size() > 1) {
      leaveScope();
    }
    return currentChar_;
  }

  currentChar_ = ch;
  // content_ += static_cast<char>(currentChar_);
  scope()->nextPos.offset++;

  if (currentChar_ != '\n') {
    scope()->nextPos.column++;
  } else {
    scope()->nextPos.column = 1;
    scope()->nextPos.line++;
  }

  return currentChar_;
}